

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSW.cpp
# Opt level: O0

void __thiscall Storage::Tape::CSW::CSW(CSW *this,string *file_name)

{
  long lVar1;
  bool bVar2;
  uint8_t uVar3;
  byte bVar4;
  byte bVar5;
  uint16_t uVar6;
  uint32_t uVar7;
  stat *psVar8;
  undefined4 *puVar9;
  size_t __nbytes;
  uchar *puVar10;
  uchar *puVar11;
  size_type sVar12;
  ulong local_148;
  uLongf output_length;
  size_t remaining_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  uint local_118;
  uint8_t extension_length;
  uint32_t number_of_waves;
  uint8_t minor_version;
  uint8_t major_version;
  FileHolder file;
  string *file_name_local;
  CSW *this_local;
  
  Tape::Tape(&this->super_Tape);
  (this->super_Tape)._vptr_Tape = (_func_int **)&PTR_is_at_end_00cab2a8;
  Tape::Pulse::Pulse((Pulse *)&(this->super_Tape).field_0x1c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->source_data_);
  this->source_data_pointer_ = 0;
  FileHolder::FileHolder((FileHolder *)&number_of_waves,file_name,ReadWrite);
  psVar8 = FileHolder::stats((FileHolder *)&number_of_waves);
  if (psVar8->st_size < 0x20) {
    puVar9 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar9 = 0;
    __cxa_throw(puVar9,&{unnamed_type#1}::typeinfo,0);
  }
  bVar2 = FileHolder::check_signature((FileHolder *)&number_of_waves,"Compressed Square Wave",0);
  if (!bVar2) {
    puVar9 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar9 = 0;
    __cxa_throw(puVar9,&{unnamed_type#1}::typeinfo,0);
  }
  uVar3 = FileHolder::get8((FileHolder *)&number_of_waves);
  if (uVar3 != '\x1a') {
    puVar9 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar9 = 0;
    __cxa_throw(puVar9,&{unnamed_type#1}::typeinfo,0);
  }
  bVar4 = FileHolder::get8((FileHolder *)&number_of_waves);
  bVar5 = FileHolder::get8((FileHolder *)&number_of_waves);
  if (((bVar4 < 3) && (bVar4 != 0)) && (bVar5 < 2)) {
    local_118 = 0;
    if (bVar4 == 1) {
      uVar6 = FileHolder::get16le((FileHolder *)&number_of_waves);
      *(uint *)&this->field_0x24 = (uint)uVar6;
      uVar3 = FileHolder::get8((FileHolder *)&number_of_waves);
      if (uVar3 != '\x01') {
        puVar9 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar9 = 0;
        __cxa_throw(puVar9,&{unnamed_type#1}::typeinfo,0);
      }
      this->compression_type_ = RLE;
      bVar4 = FileHolder::get8((FileHolder *)&number_of_waves);
      *(uint *)&(this->super_Tape).field_0x1c = (uint)((bVar4 & 1) == 0);
      FileHolder::seek((FileHolder *)&number_of_waves,0x20,0);
    }
    else {
      uVar7 = FileHolder::get32le((FileHolder *)&number_of_waves);
      *(uint32_t *)&this->field_0x24 = uVar7;
      local_118 = FileHolder::get32le((FileHolder *)&number_of_waves);
      uVar3 = FileHolder::get8((FileHolder *)&number_of_waves);
      if (uVar3 == '\x01') {
        this->compression_type_ = RLE;
      }
      else {
        if (uVar3 != '\x02') {
          puVar9 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar9 = 0;
          __cxa_throw(puVar9,&{unnamed_type#1}::typeinfo,0);
        }
        this->compression_type_ = ZRLE;
      }
      bVar4 = FileHolder::get8((FileHolder *)&number_of_waves);
      *(uint *)&(this->super_Tape).field_0x1c = (uint)((bVar4 & 1) == 0);
      file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ =
           FileHolder::get8((FileHolder *)&number_of_waves);
      psVar8 = FileHolder::stats((FileHolder *)&number_of_waves);
      if (psVar8->st_size <
          (long)(int)(file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ + 0x34)) {
        puVar9 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar9 = 0;
        __cxa_throw(puVar9,&{unnamed_type#1}::typeinfo,0);
      }
      FileHolder::seek((FileHolder *)&number_of_waves,
                       (ulong)(file_data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ + 0x34),0);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&remaining_data);
    psVar8 = FileHolder::stats((FileHolder *)&number_of_waves);
    lVar1 = psVar8->st_size;
    __nbytes = FileHolder::tell((FileHolder *)&number_of_waves);
    output_length = lVar1 - __nbytes;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&remaining_data,
               output_length);
    puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&remaining_data);
    FileHolder::read((FileHolder *)&number_of_waves,(int)puVar10,(void *)output_length,__nbytes);
    if (this->compression_type_ == ZRLE) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->source_data_,(ulong)local_118 * 5);
      local_148 = (ulong)(local_118 * 5);
      puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          (&this->source_data_);
      puVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&remaining_data)
      ;
      sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&remaining_data);
      uncompress(puVar10,&local_148,puVar11,sVar12);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->source_data_,local_148);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this->source_data_,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&remaining_data);
    }
    invert_pulse(this);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&remaining_data);
    FileHolder::~FileHolder((FileHolder *)&number_of_waves);
    return;
  }
  puVar9 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar9 = 0;
  __cxa_throw(puVar9,&{unnamed_type#1}::typeinfo,0);
}

Assistant:

CSW::CSW(const std::string &file_name) :
	source_data_pointer_(0) {
	Storage::FileHolder file(file_name);
	if(file.stats().st_size < 0x20) throw ErrorNotCSW;

	// Check signature.
	if(!file.check_signature("Compressed Square Wave")) {
		throw ErrorNotCSW;
	}

	// Check terminating byte.
	if(file.get8() != 0x1a) throw ErrorNotCSW;

	// Get version file number.
	uint8_t major_version = file.get8();
	uint8_t minor_version = file.get8();

	// Reject if this is an unknown version.
	if(major_version > 2 || !major_version || minor_version > 1) throw ErrorNotCSW;

	// The header now diverges based on version.
	uint32_t number_of_waves = 0;
	if(major_version == 1) {
		pulse_.length.clock_rate = file.get16le();

		if(file.get8() != 1) throw ErrorNotCSW;
		compression_type_ = CompressionType::RLE;

		pulse_.type = (file.get8() & 1) ? Pulse::High : Pulse::Low;

		file.seek(0x20, SEEK_SET);
	} else {
		pulse_.length.clock_rate = file.get32le();
		number_of_waves = file.get32le();
		switch(file.get8()) {
			case 1: compression_type_ = CompressionType::RLE;	break;
			case 2: compression_type_ = CompressionType::ZRLE;	break;
			default: throw ErrorNotCSW;
		}

		pulse_.type = (file.get8() & 1) ? Pulse::High : Pulse::Low;
		uint8_t extension_length = file.get8();

		if(file.stats().st_size < 0x34 + extension_length) throw ErrorNotCSW;
		file.seek(0x34 + extension_length, SEEK_SET);
	}

	// Grab all data remaining in the file.
	std::vector<uint8_t> file_data;
	std::size_t remaining_data = size_t(file.stats().st_size) - size_t(file.tell());
	file_data.resize(remaining_data);
	file.read(file_data.data(), remaining_data);

	if(compression_type_ == CompressionType::ZRLE) {
		// The only clue given by CSW as to the output size in bytes is that there will be
		// number_of_waves waves. Waves are usually one byte, but may be five. So this code
		// is pessimistic.
		source_data_.resize(size_t(number_of_waves) * 5);

		// uncompress will tell how many compressed bytes there actually were, so use its
		// modification of output_length to throw away all the memory that isn't actually
		// needed.
		uLongf output_length = uLongf(number_of_waves * 5);
		uncompress(source_data_.data(), &output_length, file_data.data(), file_data.size());
		source_data_.resize(std::size_t(output_length));
	} else {
		source_data_ = std::move(file_data);
	}

	invert_pulse();
}